

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O1

int ByteToFloat(uint8_t *src_y,float *dst_y,float scale,int width)

{
  int iVar1;
  
  iVar1 = -1;
  if (0 < width && (dst_y != (float *)0x0 && src_y != (uint8_t *)0x0)) {
    ByteToFloatRow_C(src_y,dst_y,scale,width);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int ByteToFloat(const uint8_t* src_y, float* dst_y, float scale, int width) {
  void (*ByteToFloatRow)(const uint8_t* src, float* dst, float scale,
                         int width) = ByteToFloatRow_C;
  if (!src_y || !dst_y || width <= 0) {
    return -1;
  }
#if defined(HAS_BYTETOFLOATROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ByteToFloatRow = ByteToFloatRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      ByteToFloatRow = ByteToFloatRow_NEON;
    }
  }
#endif

  ByteToFloatRow(src_y, dst_y, scale, width);
  return 0;
}